

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageSizeTests.cpp
# Opt level: O0

void __thiscall glcts::anon_unknown_0::ImageSizeMachine::~ImageSizeMachine(ImageSizeMachine *this)

{
  int local_14;
  int i;
  ImageSizeMachine *this_local;
  
  (this->super_GLWrapper)._vptr_GLWrapper = (_func_int **)&PTR__ImageSizeMachine_03257050;
  if ((this->pipeline & 1U) == 0) {
    glu::CallLogWrapper::glDeleteProgram
              (&(this->super_GLWrapper).super_CallLogWrapper,this->m_program[0]);
  }
  else {
    glu::CallLogWrapper::glDeleteProgramPipelines
              (&(this->super_GLWrapper).super_CallLogWrapper,1,&this->m_pipeline);
    for (local_14 = 0; local_14 < 3; local_14 = local_14 + 1) {
      glu::CallLogWrapper::glDeleteProgram
                (&(this->super_GLWrapper).super_CallLogWrapper,this->m_program[local_14]);
    }
  }
  glu::CallLogWrapper::glDeleteVertexArrays
            (&(this->super_GLWrapper).super_CallLogWrapper,1,&this->m_vertex_array);
  glu::CallLogWrapper::glDeleteBuffers
            (&(this->super_GLWrapper).super_CallLogWrapper,1,&this->m_buffer);
  glu::CallLogWrapper::glDeleteTransformFeedbacks
            (&(this->super_GLWrapper).super_CallLogWrapper,1,&this->m_xfb_id);
  deqp::GLWrapper::~GLWrapper(&this->super_GLWrapper);
  return;
}

Assistant:

~ImageSizeMachine()
	{
		if (pipeline)
		{
			glDeleteProgramPipelines(1, &m_pipeline);
			for (int i = 0; i < 3; ++i)
				glDeleteProgram(m_program[i]);
		}
		else
		{
			glDeleteProgram(m_program[0]);
		}
		glDeleteVertexArrays(1, &m_vertex_array);
		glDeleteBuffers(1, &m_buffer);
		glDeleteTransformFeedbacks(1, &m_xfb_id);
	}